

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldLiteGenerator::GenerateBuilderMembers
          (ImmutableStringOneofFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  LogMessage *pLVar4;
  Options *pOVar5;
  Semantic local_3a4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3a0;
  string_view local_398;
  string_view local_388;
  string_view local_378;
  Options local_368;
  Semantic local_314;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_310;
  string_view local_308;
  string_view local_2f8;
  string_view local_2e8;
  Options local_2d8;
  Semantic local_284;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_280;
  string_view local_278;
  string_view local_268;
  string_view local_258;
  Options local_248;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1f0;
  string_view local_1e8;
  string_view local_1d8;
  string_view local_1c8;
  Options local_1b8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_160;
  string_view local_158;
  string_view local_148;
  string_view local_138;
  Options local_128;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_d0;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  Options local_98;
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  Printer *local_18;
  Printer *printer_local;
  ImmutableStringOneofFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar3 = FieldDescriptor::has_presence((this->super_ImmutableStringFieldLiteGenerator).descriptor_)
  ;
  local_31 = 0;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/string_field.cc"
               ,0x1c0,"descriptor_->has_presence()");
    local_31 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar4);
  }
  pPVar2 = local_18;
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  Options::Options(&local_98,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_98,false,false,false);
  Options::~Options(&local_98);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a8,
             "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return instance.has$capitalized_name$();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_d0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_b8,local_c8,pFVar1,local_d0);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  Options::Options(&local_128,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_128,false,false,false);
  Options::~Options(&local_128);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_138,
             "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  return instance.get$capitalized_name$();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_138);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_160);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_148,local_158,pFVar1,local_160);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  Options::Options(&local_1b8,pOVar5);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,GETTER,&local_1b8,false,false,false);
  Options::~Options(&local_1b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c8,
             "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  return instance.get$capitalized_name$Bytes();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_1c8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1f0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1d8,local_1e8,pFVar1,local_1f0);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  Options::Options(&local_248,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,SETTER,&local_248,true,false,false);
  Options::~Options(&local_248);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_258,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    java.lang.String value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_258);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_278,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  local_284 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_280,&local_284);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_268,local_278,pFVar1,local_280);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  Options::Options(&local_2d8,pOVar5);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_2d8,true,false,false);
  Options::~Options(&local_2d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2e8,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_2e8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_308,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  local_314 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_310,&local_314);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_2f8,local_308,pFVar1,local_310);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  pOVar5 = Context::options((this->super_ImmutableStringFieldLiteGenerator).context_);
  Options::Options(&local_368,pOVar5);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,SETTER,&local_368,true,false,false);
  Options::~Options(&local_368);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_378,
             "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Bytes(value);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldLiteGenerator).variables_,local_378);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_388,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_398,"}");
  pFVar1 = (this->super_ImmutableStringFieldLiteGenerator).descriptor_;
  local_3a4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_3a0,&local_3a4);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_388,local_398,pFVar1,local_3a0);
  return;
}

Assistant:

void ImmutableStringOneofFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  ABSL_DCHECK(descriptor_->has_presence());
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return instance.has$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  return instance.get$capitalized_name$();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  return instance.get$capitalized_name$Bytes();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, SETTER,
                                          context_->options(),
                                          /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n"
      "    com.google.protobuf.ByteString value) {\n"
      "  copyOnWrite();\n"
      "  instance.set$capitalized_name$Bytes(value);\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}